

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

void __thiscall QTextEdit::mouseMoveEvent(QTextEdit *this,QMouseEvent *e)

{
  QTextEditPrivate *this_00;
  char cVar1;
  int iVar2;
  long in_FS_OFFSET;
  QRect local_38;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  this_00->field_0x320 = this_00->field_0x320 & 0xf7;
  local_38 = (QRect)QSinglePointEvent::position((QSinglePointEvent *)e);
  local_28 = QPointF::toPoint((QPointF *)&local_38);
  QTextEditPrivate::sendControlEvent(this_00,(QEvent *)e);
  if (((byte)e[0x44] & 1) != 0) {
    iVar2 = QMouseEvent::source();
    if (iVar2 == 0) {
      local_38 = QWidget::rect((this_00->super_QAbstractScrollAreaPrivate).viewport);
      cVar1 = QRect::contains((QPoint *)&local_38,SUB81(&local_28,0));
      if (cVar1 == '\0') {
        if ((this_00->autoScrollTimer).m_id == Invalid) {
          QBasicTimer::start(&this_00->autoScrollTimer,(Duration)0x5f5e100,(QObject *)this);
        }
      }
      else {
        QBasicTimer::stop();
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QTextEdit);
    d->inDrag = false; // paranoia
    const QPoint pos = e->position().toPoint();
    d->sendControlEvent(e);
    if (!(e->buttons() & Qt::LeftButton))
        return;
    if (e->source() == Qt::MouseEventNotSynthesized) {
        const QRect visible = d->viewport->rect();
        if (visible.contains(pos))
            d->autoScrollTimer.stop();
        else if (!d->autoScrollTimer.isActive())
            d->autoScrollTimer.start(100, this);
    }
}